

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O0

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QString *name,SslProtocol protocol)

{
  bool bVar1;
  SslProtocol SVar2;
  QSslCipher *this_00;
  const_iterator o;
  SslProtocol in_EDX;
  QSslCipherPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslCipher *cipher;
  QList<QSslCipher> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QSslCipher> ciphers;
  undefined6 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCipher *)operator_new(0x98);
  QSslCipherPrivate::QSslCipherPrivate(in_RDI);
  std::unique_ptr<QSslCipherPrivate,std::default_delete<QSslCipherPrivate>>::
  unique_ptr<std::default_delete<QSslCipherPrivate>,void>
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)in_RDI,
             (pointer)CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSslConfiguration::supportedCiphers();
  local_28.i = (QSslCipher *)0xaaaaaaaaaaaaaaaa;
  local_28 = QList<QSslCipher>::begin((QList<QSslCipher> *)in_RDI);
  o = QList<QSslCipher>::end((QList<QSslCipher> *)in_RDI);
  do {
    bVar1 = QList<QSslCipher>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) {
LAB_0038bd1d:
      QList<QSslCipher>::~QList((QList<QSslCipher> *)0x38bd27);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QSslCipher>::const_iterator::operator*(&local_28);
    QSslCipher::name(this_00);
    bVar1 = ::operator==((QString *)in_RDI,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    in_stack_ffffffffffffff6e = false;
    if (bVar1) {
      SVar2 = QSslCipher::protocol((QSslCipher *)0x38bcc4);
      in_stack_ffffffffffffff6e = SVar2 == in_EDX;
    }
    in_stack_ffffffffffffff6f = in_stack_ffffffffffffff6e;
    QString::~QString((QString *)0x38bce1);
    if ((in_stack_ffffffffffffff6e & 1) != 0) {
      operator=((QSslCipher *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),this_00)
      ;
      goto LAB_0038bd1d;
    }
    QList<QSslCipher>::const_iterator::operator++(&local_28);
  } while( true );
}

Assistant:

QSslCipher::QSslCipher(const QString &name, QSsl::SslProtocol protocol)
    : d(new QSslCipherPrivate)
{
    const auto ciphers = QSslConfiguration::supportedCiphers();
    for (const QSslCipher &cipher : ciphers) {
        if (cipher.name() == name && cipher.protocol() == protocol) {
            *this = cipher;
            return;
        }
    }
}